

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_join_leave.cxx
# Opt level: O2

ptr<resp_msg> __thiscall
nuraft::raft_server::handle_join_cluster_req(raft_server *this,req_msg *req)

{
  _func_int *p_Var1;
  pointer psVar2;
  _func_int **pp_Var3;
  long *plVar4;
  pointer psVar5;
  int iVar6;
  buffer *buf;
  long in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  shared_ptr<nuraft::resp_msg> sVar8;
  ptr<cluster_config> pVar9;
  ptr<resp_msg> pVar10;
  Param follower_param;
  ptr<cluster_config> c_config;
  uint64_t my_term;
  
  follower_param._0_8_ = req[9].super_msg_base._vptr_msg_base[1];
  c_config.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0xd
  ;
  my_term = CONCAT44(my_term._4_4_,*(undefined4 *)(in_RDX + 0x14));
  sVar8 = std::make_shared<nuraft::resp_msg,unsigned_long,nuraft::msg_type,int&,int>
                    ((unsigned_long *)this,(msg_type *)&follower_param,(int *)&c_config,
                     (int *)&req->log_entries_);
  _Var7 = sVar8.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if ((*(long *)(in_RDX + 0x40) - (long)*(long **)(in_RDX + 0x38) == 0x10) &&
     (*(char *)(**(long **)(in_RDX + 0x38) + 8) == '\x02')) {
    psVar5 = req[2].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if ((((ulong)psVar5 & 0x10000) != 0) &&
       (psVar2 = req[9].log_entries_.
                 super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage, psVar2 != (pointer)0x0)) {
      iVar6 = (*(code *)(psVar2->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr[1].buff_.
                        super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)();
      _Var7._M_pi = extraout_RDX;
      if (2 < iVar6) {
        psVar2 = req[9].log_entries_.
                 super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        msg_if_given_abi_cxx11_
                  ((string *)&follower_param,
                   "this server is already in log syncing mode, but let\'s do it again: sm idx %lu, quick commit idx %lu, will not reset commit index"
                   ,req[2].super_msg_base.term_,req[2].super_msg_base._vptr_msg_base);
        (*(code *)(psVar2->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                  [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)
                  (psVar2,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                   ,"handle_join_cluster_req",0xa2,&follower_param);
        std::__cxx11::string::~string((string *)&follower_param);
        _Var7._M_pi = extraout_RDX_00;
      }
    }
    psVar2 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (psVar2 != (pointer)0x0) {
      iVar6 = (*(code *)(psVar2->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr[1].buff_.
                        super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)();
      _Var7._M_pi = extraout_RDX_01;
      if (3 < iVar6) {
        psVar2 = req[9].log_entries_.
                 super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        msg_if_given_abi_cxx11_
                  ((string *)&follower_param,"got join cluster req from leader %d",
                   (ulong)*(uint *)(in_RDX + 0x14));
        (*(code *)(psVar2->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                  [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)
                  (psVar2,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                   ,"handle_join_cluster_req",0xa6,&follower_param);
        std::__cxx11::string::~string((string *)&follower_param);
        _Var7._M_pi = extraout_RDX_02;
      }
    }
    LOCK();
    *(undefined1 *)
     ((long)&req[2].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage + 2) = 1;
    UNLOCK();
    LOCK();
    *(undefined4 *)
     &req[8].log_entries_.
      super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = 1;
    UNLOCK();
    LOCK();
    *(undefined4 *)((long)&req->commit_idx_ + 4) = *(undefined4 *)(in_RDX + 0x14);
    UNLOCK();
    if (((ulong)psVar5 & 0x10000) == 0) {
      pp_Var3 = *(_func_int ***)&req[2].super_msg_base.dst_;
      LOCK();
      req[2].super_msg_base.term_ = (ulong)pp_Var3;
      UNLOCK();
      LOCK();
      req[2].super_msg_base._vptr_msg_base = pp_Var3;
      UNLOCK();
    }
    LOCK();
    *(undefined4 *)(req[9].super_msg_base._vptr_msg_base + 2) = 0xffffffff;
    UNLOCK();
    LOCK();
    pp_Var3 = req[9].super_msg_base._vptr_msg_base + 1;
    p_Var1 = *pp_Var3;
    *pp_Var3 = *(_func_int **)(in_RDX + 8);
    UNLOCK();
    plVar4 = (long *)**(undefined8 **)&req[4].super_msg_base.dst_;
    (**(code **)(*plVar4 + 0x20))(plVar4,req[9].super_msg_base._vptr_msg_base,_Var7._M_pi,p_Var1);
    follower_param.leaderId = *(int32_t *)((long)&req->commit_idx_ + 4);
    follower_param.myId =
         *(int32_t *)
          &(req->log_entries_).
           super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    follower_param.peerId = -1;
    my_term = (uint64_t)req[9].super_msg_base._vptr_msg_base[1];
    follower_param.ctx = &my_term;
    cb_func::call((cb_func *)(*(long *)&req[4].super_msg_base.dst_ + 0x70),BecomeFollower,
                  &follower_param);
    buf = log_entry::get_buf((log_entry *)**(undefined8 **)(in_RDX + 0x38));
    pVar9 = cluster_config::deserialize((cluster_config *)&c_config,buf);
    plVar4 = (long *)**(undefined8 **)&req[4].super_msg_base.dst_;
    (**(code **)(*plVar4 + 0x18))
              (plVar4,CONCAT44(c_config.
                               super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr._4_4_,
                               c_config.
                               super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr._0_4_),
               pVar9.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._M_pi);
    reconfigure((raft_server *)req,&c_config);
    pp_Var3 = this->_vptr_raft_server;
    pp_Var3[4] = (_func_int *)((long)req[2].super_msg_base._vptr_msg_base + 1);
    *(undefined1 *)(pp_Var3 + 6) = 1;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&c_config.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    _Var7._M_pi = extraout_RDX_03;
  }
  else {
    psVar5 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (psVar5 != (pointer)0x0) {
      iVar6 = (*(code *)(psVar5->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr[1].buff_.
                        super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)();
      _Var7._M_pi = extraout_RDX_04;
      if (3 < iVar6) {
        psVar5 = req[9].log_entries_.
                 super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        msg_if_given_abi_cxx11_
                  ((string *)&follower_param,
                   "receive an invalid JoinClusterRequest as the log entry value doesn\'t meet the requirements"
                  );
        (*(code *)(psVar5->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                  [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)
                  (psVar5,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                   ,"handle_join_cluster_req",0x94,&follower_param);
        std::__cxx11::string::~string((string *)&follower_param);
        _Var7._M_pi = extraout_RDX_05;
      }
    }
  }
  pVar10.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var7._M_pi;
  pVar10.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<resp_msg>)pVar10.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::handle_join_cluster_req(req_msg& req) {
    std::vector<ptr<log_entry>>& entries = req.log_entries();
    ptr<resp_msg> resp = cs_new<resp_msg>
                         ( state_->get_term(),
                           msg_type::join_cluster_response,
                           id_,
                           req.get_src() );
    if ( entries.size() != 1 ||
         entries[0]->get_val_type() != log_val_type::conf ) {
        p_in("receive an invalid JoinClusterRequest as the log entry value "
             "doesn't meet the requirements");
        return resp;
    }

    // MONSTOR-8244:
    //   Adding server may be called multiple times while previous process is
    //   in progress. It should gracefully handle the new request and should
    //   not ruin the current request.
    bool reset_commit_idx = true;
    if (catching_up_) {
        p_wn("this server is already in log syncing mode, "
             "but let's do it again: sm idx %" PRIu64 ", quick commit idx %" PRIu64 ", "
             "will not reset commit index",
             sm_commit_index_.load(),
             quick_commit_index_.load());
        reset_commit_idx = false;
    }

    p_in("got join cluster req from leader %d", req.get_src());
    catching_up_ = true;
    role_ = srv_role::follower;
    leader_ = req.get_src();

    if (reset_commit_idx) {
        // MONSTOR-7503: We should not reset it to 0.
        sm_commit_index_.store( initial_commit_index_ );
        quick_commit_index_.store( initial_commit_index_ );
    }

    state_->set_voted_for(-1);
    state_->set_term(req.get_term());
    ctx_->state_mgr_->save_state(*state_);

    cb_func::Param follower_param(id_, leader_);
    uint64_t my_term = state_->get_term();
    follower_param.ctx = &my_term;
    (void) ctx_->cb_func_.call(cb_func::BecomeFollower, &follower_param);

    ptr<cluster_config> c_config = cluster_config::deserialize(entries[0]->get_buf());
    // WARNING: We should make cluster config durable here. Otherwise, if
    //          this server gets restarted before receiving the first
    //          committed config (the first config that includes this server),
    //          this server will remove itself immediately by replaying
    //          previous config which does not include this server.
    ctx_->state_mgr_->save_config(*c_config);
    reconfigure(c_config);

    resp->accept( quick_commit_index_.load() + 1 );
    return resp;
}